

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btorsimam.cpp
# Opt level: O0

bool data_is_subset(BtorSimArrayModel *self,BtorSimArrayModel *other)

{
  BtorSimArrayModel *this;
  bool bVar1;
  _Bool _Var2;
  int32_t iVar3;
  BtorSimBitVector *pBVar4;
  uint64_t idx_00;
  BtorSimArrayModel *in_RSI;
  long in_RDI;
  int is_different_from_random_init;
  BtorSimBitVector *initval;
  BtorSimBitVector *idx;
  value_type i;
  const_iterator __end1;
  const_iterator __begin1;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BtorSimBitVector_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BtorSimBitVector_*>_>_>
  *__range1;
  undefined4 in_stack_ffffffffffffff18;
  uint32_t in_stack_ffffffffffffff1c;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BtorSimBitVector_*>
  *in_stack_ffffffffffffff20;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BtorSimBitVector_*>,_true>
  local_78 [3];
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BtorSimBitVector_*>,_true>
  local_60 [5];
  BtorSimBitVector *local_38;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BtorSimBitVector_*>,_true>
  local_30;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BtorSimBitVector_*>,_true>
  local_28;
  long local_20;
  BtorSimArrayModel *local_18;
  byte local_1;
  
  local_20 = in_RDI + 0x20;
  local_18 = in_RSI;
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BtorSimBitVector_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BtorSimBitVector_*>_>_>
       ::begin((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BtorSimBitVector_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BtorSimBitVector_*>_>_>
                *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BtorSimBitVector_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BtorSimBitVector_*>_>_>
       ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BtorSimBitVector_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BtorSimBitVector_*>_>_>
              *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
  while (bVar1 = std::__detail::operator!=(&local_28,&local_30), bVar1) {
    std::__detail::
    _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BtorSimBitVector_*>,_false,_true>
    ::operator*((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BtorSimBitVector_*>,_false,_true>
                 *)0x1211c0);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BtorSimBitVector_*>
    ::pair(in_stack_ffffffffffffff20,
           (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BtorSimBitVector_*>
            *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
    local_60[0]._M_cur =
         (__node_type *)
         std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BtorSimBitVector_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BtorSimBitVector_*>_>_>
         ::find((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BtorSimBitVector_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BtorSimBitVector_*>_>_>
                 *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                (key_type *)0x1211eb);
    local_78[0]._M_cur =
         (__node_type *)
         std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BtorSimBitVector_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BtorSimBitVector_*>_>_>
         ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BtorSimBitVector_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BtorSimBitVector_*>_>_>
                *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
    bVar1 = std::__detail::operator==(local_60,local_78);
    if (bVar1) {
      if (local_18->const_init == (BtorSimBitVector *)0x0) {
        if (local_18->random_seed == 0) {
          _Var2 = btorsim_bv_is_zero(local_38);
          if (_Var2) goto LAB_00121411;
          local_1 = 0;
          bVar1 = true;
        }
        else {
          std::__cxx11::string::c_str();
          pBVar4 = btorsim_bv_char_to_bv((char *)in_stack_ffffffffffffff20);
          this = local_18;
          idx_00 = btorsim_bv_to_uint64(pBVar4);
          BtorSimArrayModel::get_random_init(this,idx_00);
          pBVar4 = btorsim_bv_uint64_to_bv
                             ((uint64_t)in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
          iVar3 = btorsim_bv_compare(local_38,pBVar4);
          btorsim_bv_free((BtorSimBitVector *)0x121358);
          btorsim_bv_free((BtorSimBitVector *)0x121364);
          if (iVar3 == 0) {
LAB_00121411:
            bVar1 = false;
          }
          else {
            local_1 = 0;
            bVar1 = true;
          }
        }
      }
      else {
        iVar3 = btorsim_bv_compare(local_38,local_18->const_init);
        if (iVar3 == 0) goto LAB_00121411;
        local_1 = 0;
        bVar1 = true;
      }
    }
    else {
      in_stack_ffffffffffffff20 =
           (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BtorSimBitVector_*>
            *)std::
              unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BtorSimBitVector_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BtorSimBitVector_*>_>_>
              ::at((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BtorSimBitVector_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BtorSimBitVector_*>_>_>
                    *)in_stack_ffffffffffffff20,
                   (key_type *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
      in_stack_ffffffffffffff1c =
           btorsim_bv_compare(*(BtorSimBitVector **)in_stack_ffffffffffffff20,local_38);
      if (in_stack_ffffffffffffff1c == 0) goto LAB_00121411;
      local_1 = 0;
      bVar1 = true;
    }
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BtorSimBitVector_*>
    ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BtorSimBitVector_*>
             *)0x121426);
    if (bVar1) goto LAB_0012144e;
    std::__detail::
    _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BtorSimBitVector_*>,_false,_true>
    ::operator++((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BtorSimBitVector_*>,_false,_true>
                  *)in_stack_ffffffffffffff20);
  }
  local_1 = 1;
LAB_0012144e:
  return (bool)(local_1 & 1);
}

Assistant:

bool
data_is_subset (const BtorSimArrayModel& self, const BtorSimArrayModel& other)
{
  for (auto i : self.data)
  // check all accessed elements in self have same value in other
  {
    if (other.data.find (i.first) == other.data.end ())
    // data is not in other, but may be same as initial value if an extra read
    // was called on self
    {
      if (other.const_init)  // init value is from init statement
      {
        if (btorsim_bv_compare (i.second, other.const_init)) return false;
      }
      else if (other.random_seed)  // init value is from randomize
      {
        BtorSimBitVector* idx     = btorsim_bv_char_to_bv (i.first.c_str ());
        BtorSimBitVector* initval = btorsim_bv_uint64_to_bv (
            other.get_random_init (btorsim_bv_to_uint64 (idx)),
            other.element_width);
        int is_different_from_random_init =
            btorsim_bv_compare (i.second, initval);
        btorsim_bv_free (idx);
        btorsim_bv_free (initval);
        if (is_different_from_random_init) return false;
      }
      else  // init value is zero
      {
        if (!btorsim_bv_is_zero (i.second)) return false;
      }
    }
    else if (btorsim_bv_compare (other.data.at (i.first), i.second) != 0)
      return false;
  }
  return true;
}